

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

bool __thiscall
dxil_spv::CFGStructurizer::continue_block_can_merge(CFGStructurizer *this,CFGNode *node)

{
  CFGNode *node_00;
  pointer ppCVar1;
  bool bVar2;
  uint uVar3;
  CFGNode *in_RAX;
  CFGNode *pCVar4;
  CFGNode *pCVar5;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var6;
  pointer ppCVar7;
  CFGNode *common_post_dominator;
  CFGNode *local_38;
  
  node_00 = node->succ_back_edge;
  ppCVar1 = (node->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  for (ppCVar7 = (node->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar7 != ppCVar1;
      ppCVar7 = ppCVar7 + 1) {
    pCVar4 = (*ppCVar7)->succ_back_edge;
    if (node_00 != pCVar4 && pCVar4 != (CFGNode *)0x0) {
      bVar2 = CFGNode::dominates(node_00,pCVar4);
      if (bVar2) goto LAB_00136679;
    }
  }
  if (((node->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (node->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) && ((node->ir).terminator.type == Branch)) {
LAB_0013656c:
    bVar2 = false;
  }
  else {
    if ((node_00->ir).terminator.type == Switch) {
      pCVar4 = find_common_post_dominator(&node_00->succ);
      pCVar5 = find_natural_switch_merge_block(this,node_00,pCVar4);
      if ((pCVar4 == node) && (pCVar5 != pCVar4)) goto LAB_0013656c;
    }
    ppCVar7 = (node->pred).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar1 = (node->pred).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    if (ppCVar7 != ppCVar1) {
      pCVar4 = (CFGNode *)0x0;
      do {
        pCVar5 = *ppCVar7;
        uVar3 = CFGNode::num_forward_preds(pCVar5);
        if ((1 < uVar3) &&
           (node_00 != pCVar5 &&
            8 < (ulong)((long)(pCVar5->succ).
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar5->succ).
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start))) {
          bVar2 = CFGNode::dominates(pCVar5,node);
          if (!bVar2) {
            bVar2 = CFGNode::post_dominates(node,pCVar5);
            if (!bVar2) {
              local_38 = CFGNode::find_common_post_dominator(node,pCVar5);
              if (local_38 != (CFGNode *)0x0) {
                _Var6 = std::
                        __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                                  ((node->succ).
                                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (node->succ).
                                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&local_38);
                if (_Var6._M_current ==
                    (node->succ).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  pCVar4 = pCVar5;
                }
              }
            }
          }
        }
        if ((pCVar5->ir).terminator.type == Switch) {
          bVar2 = CFGNode::post_dominates(node,pCVar5);
          if (!bVar2) goto LAB_0013656c;
        }
        ppCVar7 = ppCVar7 + 1;
      } while (ppCVar7 != ppCVar1);
      if (pCVar4 != (CFGNode *)0x0) {
        ppCVar1 = (node->pred).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar7 = (node->pred).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppCVar7 != ppCVar1;
            ppCVar7 = ppCVar7 + 1) {
          pCVar5 = *ppCVar7;
          if ((pCVar5 != node_00) && (pCVar5 != pCVar4)) {
            bVar2 = CFGNode::dominates(pCVar5,node);
            if (!bVar2) goto LAB_0013656c;
          }
        }
      }
LAB_00136679:
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool CFGStructurizer::continue_block_can_merge(CFGNode *node) const
{
	const CFGNode *pred_candidate = nullptr;
	auto *header = node->succ_back_edge;

	// This algorithm is very arbitrary and should be seen as a nasty heuristic which solves real shaders
	// we see in the wild. It's probably safe to block continue merge in far more cases than this, but we
	// want to be maximally convergent as often as we can.

	for (auto *pred : node->pred)
	{
		// This is the merge block of another inner loop, we really need an intermediate merge.
		if (pred->succ_back_edge && header != pred->succ_back_edge && header->dominates(pred->succ_back_edge))
			return true;
	}

	// Plain continue block that does nothing useful. No point merging this.
	// A continue block's succ is sometimes used to aid analysis and simplify other passes,
	// use terminator here explicitly.
	if (node->ir.operations.empty() && node->ir.terminator.type == Terminator::Type::Branch)
		return false;

	if (header->ir.terminator.type == Terminator::Type::Switch)
	{
		// If the loop header is also a switch statement, there can be some nasty edge cases.
		// We likely never intend for the continue block to be maximally convergent here
		// if the natural merge block is not the continue block.
		auto *merge = find_common_post_dominator(header->succ);
		auto *natural_merge = find_natural_switch_merge_block(header, merge);
		if (merge == node && natural_merge != merge)
			return false;
	}

	for (auto *pred : node->pred)
	{
		// If we have a situation where a continue block has a pred which is itself a selection merge target, that
		// block is the merge target where we follow maximum convergence.
		// The candidate must be inside loop body and not the header itself.
		// Neither continue block nor merge target have any dominance relationship.

		if (pred->num_forward_preds() >= 2 && pred->succ.size() >= 2 &&
		    header != pred && !pred->dominates(node) &&
		    !node->post_dominates(pred))
		{
			// If execution does not merge up right at the natural break block,
			// things will get very complicated.
			// In practice, we can handle merges as long as the candidate just breaks out normally.
			// If not, we have to introduce ladder breaking and this is (almost) impossible to get right.
			auto *common_post_dominator = CFGNode::find_common_post_dominator(node, pred);
			if (common_post_dominator &&
			    std::find(node->succ.begin(), node->succ.end(), common_post_dominator) == node->succ.end())
			{
				pred_candidate = pred;
			}
		}

		// If we have a situation where a switch block inside our loop uses the continue block
		// as a continue target, it's important that we keep this block as a continue block,
		// otherwise, it will complicate the switch block greatly.
		if (pred->ir.terminator.type == Terminator::Type::Switch && !node->post_dominates(pred))
			return false;
	}

	// No obviously nasty case to handle, probably safe to let the algorithm do its thing ...
	if (!pred_candidate)
		return true;

	// Need to find another escape edge which is neither header nor the candidate.
	bool found_another_escape_edge = false;
	for (auto *pred : node->pred)
	{
		if (pred != header && pred != pred_candidate && !pred->dominates(node))
		{
			found_another_escape_edge = true;
			break;
		}
	}

	// If we have yet another escape edge, we probably cannot merge to continue ...
	return !found_another_escape_edge;
}